

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O1

unique_ptr<S2Shape,_std::default_delete<S2Shape>_> __thiscall
s2shapeutil::TaggedShapeFactory::operator[](TaggedShapeFactory *this,int shape_id)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar3;
  Decoder decoder;
  uint local_4c;
  byte **local_48;
  byte *local_40;
  byte *local_38;
  byte *local_30;
  
  lVar3 = CONCAT44(in_register_00000034,shape_id);
  if (in_EDX == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = s2coding::EncodedUintVector<unsigned_long_long>::operator[]
                      ((EncodedUintVector<unsigned_long_long> *)(lVar3 + 0x28),in_EDX + -1);
  }
  uVar2 = s2coding::EncodedUintVector<unsigned_long_long>::operator[]
                    ((EncodedUintVector<unsigned_long_long> *)(lVar3 + 0x28),in_EDX);
  local_40 = (byte *)(*(long *)(lVar3 + 0x38) + uVar1);
  local_30 = (byte *)(*(long *)(lVar3 + 0x38) + uVar2);
  if ((long)uVar1 < (long)uVar2) {
    local_4c = *local_40 & 0x7f;
    uVar2 = (unsigned_long_long)local_4c;
    local_38 = local_40 + 1;
    if (-1 < (char)*local_40) goto LAB_0022a361;
    if (local_40 + 1 < local_30) {
      local_4c = local_4c | (local_40[1] & 0x7f) << 7;
      uVar2 = (unsigned_long_long)local_4c;
      local_38 = local_40 + 2;
      if (-1 < (char)local_40[1]) goto LAB_0022a361;
      if (local_40 + 2 < local_30) {
        local_4c = local_4c | (local_40[2] & 0x7f) << 0xe;
        uVar2 = (unsigned_long_long)local_4c;
        local_38 = local_40 + 3;
        if (-1 < (char)local_40[2]) goto LAB_0022a361;
        if (local_40 + 3 < local_30) {
          local_4c = local_4c | (local_40[3] & 0x7f) << 0x15;
          uVar2 = (unsigned_long_long)local_4c;
          local_38 = local_40 + 4;
          if (-1 < (char)local_40[3]) goto LAB_0022a361;
          if (local_40 + 4 < local_30) {
            local_4c = local_4c | (uint)local_40[4] << 0x1c;
            local_38 = (byte *)0x0;
            if (local_40[4] < 0x10) {
              local_38 = local_40 + 5;
            }
            goto LAB_0022a361;
          }
        }
      }
    }
  }
  local_4c = (uint)uVar2;
  local_38 = (byte *)0x0;
LAB_0022a361:
  if (local_38 == (byte *)0x0) {
    (this->super_ShapeFactory)._vptr_ShapeFactory = (_func_int **)0x0;
  }
  else {
    local_48 = &local_40;
    if (*(long *)(lVar3 + 0x18) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(lVar3 + 0x20))(this,lVar3 + 8,&local_4c,&local_48);
  }
  return (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)
         (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)this;
}

Assistant:

unique_ptr<S2Shape> TaggedShapeFactory::operator[](int shape_id) const {
  Decoder decoder = encoded_shapes_.GetDecoder(shape_id);
  S2Shape::TypeTag tag;
  if (!decoder.get_varint32(&tag)) return nullptr;
  return shape_decoder_(tag, &decoder);
}